

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status
fdb_get_nearest(fdb_kvs_handle *handle,void *key,size_t keylen,fdb_doc *doc,
               fdb_get_nearest_opt_t opt)

{
  atomic<unsigned_long> *paVar1;
  ushort uVar2;
  fdb_kvs_id_t id;
  hbtrie *trie;
  btreeblk_handle *pbVar3;
  fdb_custom_cmp_variable p_Var4;
  long lVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined8 uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [14];
  void *pvVar11;
  size_t offset_00;
  uint64_t uVar12;
  hbtrie_result hVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  int64_t iVar17;
  ulong uVar18;
  undefined1 *buf;
  docio_handle *pdVar19;
  void *pvVar20;
  long in_FS_OFFSET;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined8 uStack_140;
  undefined1 auStack_138 [8];
  undefined1 local_130 [8];
  hbtrie_iterator hit;
  fdb_kvs_id_t kv_id;
  undefined1 auStack_88 [8];
  docio_object _doc;
  void *local_48;
  size_t ret_keylen;
  uint64_t offset;
  
  buf = auStack_138;
  auStack_88._0_2_ = 0;
  auStack_88._2_2_ = 0;
  auStack_88._4_4_ = 0;
  _doc.length.keylen = 0;
  _doc.length.metalen = 0;
  _doc.length.bodylen = 0;
  _doc.length.bodylen_ondisk = 0;
  _doc.timestamp = 0;
  _doc._20_4_ = 0;
  _doc.key = (void *)0x0;
  _doc.field_3.seqnum = 0;
  _doc.meta = (void *)0x0;
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if ((handle->config).do_not_search_wal != true) {
    return FDB_RESULT_INVALID_CONFIG;
  }
  if (keylen - 0xff81 < 0xffffffffffff0080) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (key != (void *)0x0) {
    if (doc == (fdb_doc *)0x0) {
      return FDB_RESULT_INVALID_ARGS;
    }
    if (((handle->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0) &&
       ((handle->config).blocksize - 0x100 < keylen)) {
      return FDB_RESULT_INVALID_ARGS;
    }
    LOCK();
    bVar21 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
    if (bVar21) {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
    }
    UNLOCK();
    if (!bVar21) {
      return FDB_RESULT_HANDLE_BUSY;
    }
    if (handle->kvs != (kvs_info *)0x0) {
      uVar18 = (ulong)(handle->config).chunksize;
      _doc.body = (void *)(uVar18 + keylen);
      lVar5 = -(uVar18 + keylen + 0xf & 0xfffffffffffffff0);
      buf = auStack_138 + lVar5;
      id = handle->kvs->id;
      offset = (uint64_t)key;
      *(undefined8 *)((long)&uStack_140 + lVar5) = 0x11da65;
      kvid2buf(uVar18,id,buf);
      uVar12 = offset;
      *(undefined8 *)((long)&uStack_140 + lVar5) = 0x11da77;
      memcpy(buf + uVar18,(void *)uVar12,keylen);
      keylen = (size_t)_doc.body;
      key = buf;
    }
    if (handle->shandle == (snap_handle *)0x0) {
      *(undefined8 *)(buf + -8) = 0x11daab;
      fdb_check_file_reopen(handle,(file_status_t *)0x0);
      pdVar19 = handle->dhandle;
      if (handle->shandle == (snap_handle *)0x0) {
        *(undefined8 *)(buf + -8) = 0x11dac1;
        fdb_sync_db_header(handle);
      }
    }
    else {
      pdVar19 = handle->dhandle;
    }
    LOCK();
    paVar1 = &handle->op_stats->num_gets;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    *(undefined8 *)(buf + -8) = 0x11dad2;
    _fdb_sync_dirty_root(handle);
    if (*(char *)(in_FS_OFFSET + -0x78) == '\0') {
      *(undefined8 *)(buf + -8) = 0x11de3a;
      fdb_get_nearest_cold_1();
    }
    local_48 = (void *)0x0;
    trie = handle->trie;
    *(undefined8 *)(buf + -8) = 0x11daff;
    hVar13 = hbtrie_iterator_init(trie,(hbtrie_iterator *)local_130,key,keylen);
    if (hVar13 == HBTRIE_RESULT_SUCCESS) {
      _doc.body = pdVar19;
      offset = (uint64_t)key;
      if (opt < 2) {
        do {
          pvVar20 = *(void **)(in_FS_OFFSET + -0x90);
          *(undefined8 *)(buf + -8) = 0x11db53;
          hVar13 = hbtrie_next((hbtrie_iterator *)local_130,pvVar20,(size_t *)&local_48,&ret_keylen)
          ;
          uVar12 = offset;
          pvVar11 = local_48;
          p_Var4 = (handle->kvs_config).custom_cmp;
          pvVar20 = *(void **)(in_FS_OFFSET + -0x90);
          if (p_Var4 == (fdb_custom_cmp_variable)0x0) {
            if ((void *)keylen == local_48) {
              *(undefined8 *)(buf + -8) = 0x11db92;
              iVar14 = memcmp((void *)uVar12,pvVar20,keylen);
            }
            else {
              pvVar16 = local_48;
              if (keylen < local_48) {
                pvVar16 = (void *)keylen;
              }
              *(undefined8 *)(buf + -8) = 0x11dbaa;
              iVar15 = memcmp((void *)uVar12,pvVar20,(size_t)pvVar16);
              iVar14 = (int)keylen - (int)pvVar11;
              if (iVar15 != 0) {
                iVar14 = iVar15;
              }
            }
          }
          else {
            pvVar16 = (handle->kvs_config).custom_cmp_param;
            *(undefined8 *)(buf + -8) = 0x11db7c;
            iVar14 = (*p_Var4)((void *)uVar12,keylen,pvVar20,(size_t)pvVar11,pvVar16);
          }
        } while (((0 < iVar14 || opt != '\0') && (opt != '\x01' || -1 < iVar14)) &&
                (hVar13 == HBTRIE_RESULT_SUCCESS));
      }
      else {
        do {
          pvVar20 = *(void **)(in_FS_OFFSET + -0x90);
          *(undefined8 *)(buf + -8) = 0x11dc0d;
          hVar13 = hbtrie_prev((hbtrie_iterator *)local_130,pvVar20,(size_t *)&local_48,&ret_keylen)
          ;
          uVar12 = offset;
          pvVar11 = local_48;
          p_Var4 = (handle->kvs_config).custom_cmp;
          pvVar20 = *(void **)(in_FS_OFFSET + -0x90);
          if (p_Var4 == (fdb_custom_cmp_variable)0x0) {
            if ((void *)keylen == local_48) {
              *(undefined8 *)(buf + -8) = 0x11dc4c;
              iVar14 = memcmp((void *)uVar12,pvVar20,keylen);
            }
            else {
              pvVar16 = local_48;
              if (keylen < local_48) {
                pvVar16 = (void *)keylen;
              }
              *(undefined8 *)(buf + -8) = 0x11dc64;
              iVar15 = memcmp((void *)uVar12,pvVar20,(size_t)pvVar16);
              iVar14 = (int)keylen - (int)pvVar11;
              if (iVar15 != 0) {
                iVar14 = iVar15;
              }
            }
          }
          else {
            pvVar16 = (handle->kvs_config).custom_cmp_param;
            *(undefined8 *)(buf + -8) = 0x11dc36;
            iVar14 = (*p_Var4)((void *)uVar12,keylen,pvVar20,(size_t)pvVar11,pvVar16);
          }
        } while (((iVar14 < 0 || opt != '\x02') && (opt != '\x03' || iVar14 < 1)) &&
                (hVar13 == HBTRIE_RESULT_SUCCESS));
      }
      *(undefined8 *)(buf + -8) = 0x11dcaa;
      hbtrie_iterator_free((hbtrie_iterator *)local_130);
      pbVar3 = handle->bhandle;
      *(undefined8 *)(buf + -8) = 0x11dcb3;
      btreeblk_end(pbVar3);
      ret_keylen = ret_keylen >> 0x38 | (ret_keylen & 0xff000000000000) >> 0x28 |
                   (ret_keylen & 0xff0000000000) >> 0x18 | (ret_keylen & 0xff00000000) >> 8 |
                   (ret_keylen & 0xff000000) << 8 | (ret_keylen & 0xff0000) << 0x18 |
                   (ret_keylen & 0xff00) << 0x28 | ret_keylen << 0x38;
      *(undefined8 *)(buf + -8) = 0x11dcc6;
      _fdb_release_dirty_root(handle);
      offset_00 = ret_keylen;
      pvVar20 = _doc.body;
      if (hVar13 == HBTRIE_RESULT_SUCCESS) {
        *(undefined8 *)(buf + -8) = 0x11dcf7;
        iVar17 = docio_read_doc((docio_handle *)pvVar20,offset_00,(docio_object *)auStack_88,true);
        uVar8 = _doc._16_8_;
        if (iVar17 < 1) {
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
          if (iVar17 != 0) {
            return (fdb_status)iVar17;
          }
          return FDB_RESULT_KEY_NOT_FOUND;
        }
        if ((_doc.length.bodylen & 4) == 0) {
          if (handle->kvs != (kvs_info *)0x0) {
            uVar2 = (handle->config).chunksize;
            *(undefined8 *)(buf + -8) = 0x11dd2d;
            buf2kvid((ulong)uVar2,(void *)uVar8,(fdb_kvs_id_t *)&hit.flags);
            uVar8 = _doc._16_8_;
            if (hit._144_8_ != handle->kvs->id) {
              LOCK();
              if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
              }
              UNLOCK();
              *(undefined8 *)(buf + -8) = 0x11de30;
              free_docio_object((docio_object *)auStack_88,'\x01','\x01','\x01');
              return FDB_RESULT_KEY_NOT_FOUND;
            }
            auStack_88._0_2_ = auStack_88._0_2_ - uVar2;
            pvVar20 = (void *)((ulong)uVar2 + _doc._16_8_);
            uVar18 = (ulong)(ushort)auStack_88._0_2_;
            *(undefined8 *)(buf + -8) = 0x11dd5a;
            memmove((void *)uVar8,pvVar20,uVar18);
          }
          doc->key = (void *)_doc._16_8_;
          doc->seqnum = (fdb_seqnum_t)_doc.key;
          uVar8 = CONCAT44(auStack_88._4_4_,CONCAT22(auStack_88._2_2_,auStack_88._0_2_));
          auVar9._8_2_ = _doc.length.keylen;
          auVar9._10_2_ = _doc.length.metalen;
          auVar9._0_8_ = uVar8;
          auVar6._10_2_ = 0;
          auVar6._0_10_ = auVar9._0_10_;
          auVar6._12_2_ = SUB42(auStack_88._4_4_,2);
          auVar7._8_2_ = (short)auStack_88._4_4_;
          auVar7._0_8_ = uVar8;
          auVar7._10_4_ = auVar6._10_4_;
          auVar10._6_8_ = 0;
          auVar10._0_6_ = auVar7._8_6_;
          auVar22._0_8_ = (ulong)CONCAT22(auStack_88._2_2_,auStack_88._0_2_) & 0xffff;
          auVar22._8_4_ = (int)CONCAT82(SUB148(auVar10 << 0x40,6),auStack_88._2_2_);
          auVar22._12_4_ = 0;
          doc->keylen = auVar22._0_8_;
          doc->metalen = auVar22._8_8_;
          doc->bodylen = (ulong)(uint)auStack_88._4_4_;
          doc->meta = (void *)_doc.field_3;
          doc->body = _doc.meta;
          doc->deleted = (bool)((byte)_doc.length.bodylen >> 2 & 1);
          doc->size_ondisk =
               (ulong)((uint)(ushort)auStack_88._0_2_ + (uint)(ushort)auStack_88._2_2_ +
                      _doc.length._0_4_) + 0x20;
          doc->offset = ret_keylen;
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
          return FDB_RESULT_SUCCESS;
        }
        *(undefined8 *)(buf + -8) = 0x11de07;
        free_docio_object((docio_object *)auStack_88,'\x01','\x01','\x01');
      }
    }
    else {
      pbVar3 = handle->bhandle;
      *(undefined8 *)(buf + -8) = 0x11db0c;
      btreeblk_end(pbVar3);
      ret_keylen = ret_keylen >> 0x38 | (ret_keylen & 0xff000000000000) >> 0x28 |
                   (ret_keylen & 0xff0000000000) >> 0x18 | (ret_keylen & 0xff00000000) >> 8 |
                   (ret_keylen & 0xff000000) << 8 | (ret_keylen & 0xff0000) << 0x18 |
                   (ret_keylen & 0xff00) << 0x28 | ret_keylen << 0x38;
      *(undefined8 *)(buf + -8) = 0x11db1f;
      _fdb_release_dirty_root(handle);
    }
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    return FDB_RESULT_KEY_NOT_FOUND;
  }
  return FDB_RESULT_INVALID_ARGS;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_nearest(fdb_kvs_handle *handle,
                           const void *key,
                           size_t keylen,
                           fdb_doc *doc,
                           fdb_get_nearest_opt_t opt)
{
    uint64_t offset;
    int64_t _offset;
    struct docio_object _doc;
    struct docio_handle *dhandle;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_txn *txn;
    //fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle->config.do_not_search_wal) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!doc || !key || keylen == 0 ||
        keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    // Need to prepend 8-byte ID in multi-KVS mode.
    void* doc_key = (void*)key;
    size_t doc_keylen = keylen;

    if (handle->kvs) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_keylen = keylen + size_chunk;
        doc_key = alca(uint8_t, doc_keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_key);
        memcpy((uint8_t*)doc_key + size_chunk, key, keylen);
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    dhandle = handle->dhandle;

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    _fdb_sync_dirty_root(handle);

    struct hbtrie_iterator hit;

    thread_local std::vector<char> ret_key_buf(FDB_MAX_KEYLEN_INTERNAL);
    size_t ret_keylen = 0;

    hr = hbtrie_iterator_init(handle->trie, &hit, doc_key, doc_keylen);
    if (hr == HBTRIE_RESULT_SUCCESS) {
        // NOTE: Due to HB-trie's suffix skip, may need to call prev/next
        //       multiple times.
        if (opt == FDB_GET_GREATER_OR_EQUAL || opt == FDB_GET_GREATER) {
            do {
                hr = hbtrie_next(&hit, &ret_key_buf[0], &ret_keylen, (void *)&offset);
                int cmp = 0;
                if (handle->kvs_config.custom_cmp) {
                    cmp = handle->kvs_config.custom_cmp(
                              doc_key, doc_keylen,
                              &ret_key_buf[0], ret_keylen,
                              handle->kvs_config.custom_cmp_param );
                } else {
                    cmp = _lex_keycmp( doc_key, doc_keylen,
                                       &ret_key_buf[0], ret_keylen );
                }
                if (opt == FDB_GET_GREATER_OR_EQUAL && cmp <= 0) break;
                if (opt == FDB_GET_GREATER && cmp < 0) break;
            } while (hr == HBTRIE_RESULT_SUCCESS);

        } else {
            do {
                hr = hbtrie_prev(&hit, &ret_key_buf[0], &ret_keylen, (void *)&offset);
                int cmp = 0;
                if (handle->kvs_config.custom_cmp) {
                    cmp = handle->kvs_config.custom_cmp(
                              doc_key, doc_keylen,
                              &ret_key_buf[0], ret_keylen,
                              handle->kvs_config.custom_cmp_param );
                } else {
                    cmp = _lex_keycmp( doc_key, doc_keylen,
                                       &ret_key_buf[0], ret_keylen );
                }
                if (opt == FDB_GET_SMALLER_OR_EQUAL && cmp >= 0) break;
                if (opt == FDB_GET_SMALLER && cmp > 0) break;
            } while (hr == HBTRIE_RESULT_SUCCESS);
        }
        hbtrie_iterator_free(&hit);
    }
    btreeblk_end(handle->bhandle);
    offset = _endian_decode(offset);

    _fdb_release_dirty_root(handle);

    if (hr == HBTRIE_RESULT_SUCCESS) {
        _offset = docio_read_doc(dhandle, offset, &_doc, true);
        if (_offset <= 0) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.flag & DOCIO_DELETED) {
            free_docio_object(&_doc, 1, 1, 1);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        if (handle->kvs) {
            fdb_kvs_id_t kv_id;
            size_t size_chunk = handle->config.chunksize;
            buf2kvid(size_chunk, _doc.key, &kv_id);
            if (kv_id != handle->kvs->id) {
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                free_docio_object(&_doc, 1, 1, 1);
                return FDB_RESULT_KEY_NOT_FOUND;
            }
            _doc.length.keylen -= size_chunk;
            memmove(_doc.key, (uint8_t*)_doc.key + size_chunk, _doc.length.keylen);
        }
        doc->key = _doc.key;
        doc->keylen = _doc.length.keylen;

        doc->seqnum = _doc.seqnum;
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}